

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int luaV_forlimit(TValue *obj,lua_Integer *p,lua_Integer step,int *stopnow)

{
  int iVar1;
  int iVar2;
  lua_Number n;
  
  *stopnow = 0;
  if (obj->tt_ == 0x13) {
    *p = (lua_Integer)obj->value_;
    iVar2 = 1;
  }
  else {
    iVar1 = luaV_tointeger(obj,p,F2Ifloor - (int)(step >> 0x3f));
    iVar2 = 1;
    if (iVar1 == 0) {
      if ((obj->tt_ == 3) || (iVar1 = luaV_tonumber_(obj,&n), obj = (TValue *)&n, iVar1 != 0)) {
        if ((obj->value_).n <= 0.0) {
          *p = -0x8000000000000000;
          if (step < 0) {
            return 1;
          }
        }
        else {
          *p = 0x7fffffffffffffff;
          if (-1 < step) {
            return 1;
          }
        }
        *stopnow = 1;
      }
      else {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int luaV_forlimit (const TValue *obj, lua_Integer *p, lua_Integer step,
                     int *stopnow) {
  *stopnow = 0;  /* usually, let loops run */
  if (ttisinteger(obj))
    *p = ivalue(obj);
  else if (!luaV_tointeger(obj, p, (step < 0 ? F2Iceil : F2Ifloor))) {
    /* not coercible to in integer */
    lua_Number n;  /* try to convert to float */
    if (!tonumber(obj, &n)) /* cannot convert to float? */
      return 0;  /* not a number */
    if (luai_numlt(0, n)) {  /* if true, float is larger than max integer */
      *p = LUA_MAXINTEGER;
      if (step < 0) *stopnow = 1;
    }
    else {  /* float is smaller than min integer */
      *p = LUA_MININTEGER;
      if (step >= 0) *stopnow = 1;
    }
  }
  return 1;
}